

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O1

int __thiscall
jrtplib::RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::
DeleteElement(RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
              *this,uint *elem)

{
  uint uVar1;
  HashElement *pHVar2;
  RTPMemoryManager *pRVar3;
  int iVar4;
  HashElement *pHVar5;
  bool bVar6;
  HashElement *pHVar7;
  bool bVar8;
  
  uVar1 = *elem;
  pHVar7 = this->table[uVar1 % 0x207d];
  this->curhashelem = pHVar7;
  bVar6 = false;
  do {
    pHVar5 = pHVar7;
    if (pHVar5 == (HashElement *)0x0) {
      iVar4 = -5;
      goto LAB_00124085;
    }
    pHVar7 = pHVar5;
    bVar8 = true;
    if (pHVar5->element != uVar1) {
      pHVar7 = pHVar5->hashnext;
      this->curhashelem = pHVar7;
      bVar8 = bVar6;
    }
    bVar6 = bVar8;
  } while (!bVar8);
  iVar4 = 0;
LAB_00124085:
  if (pHVar5 == (HashElement *)0x0) {
    return iVar4;
  }
  pHVar7 = this->curhashelem;
  if (pHVar7 == (HashElement *)0x0) {
    return -7;
  }
  pHVar5 = pHVar7->hashprev;
  pHVar2 = pHVar7->hashnext;
  if (pHVar5 == (HashElement *)0x0) {
    this->table[pHVar7->hashindex] = pHVar2;
    if (pHVar2 == (HashElement *)0x0) goto LAB_001240cf;
    pHVar5 = (HashElement *)0x0;
  }
  else {
    pHVar5->hashnext = pHVar2;
    if (pHVar2 == (HashElement *)0x0) goto LAB_001240cf;
  }
  pHVar2->hashprev = pHVar5;
LAB_001240cf:
  pHVar7 = this->curhashelem;
  pHVar5 = pHVar7->listprev;
  pHVar2 = pHVar7->listnext;
  if (pHVar5 == (HashElement *)0x0) {
    this->firsthashelem = pHVar2;
    if (pHVar2 == (HashElement *)0x0) {
      this->lasthashelem = (HashElement *)0x0;
    }
    else {
      pHVar2->listprev = (HashElement *)0x0;
    }
  }
  else {
    pHVar5->listnext = pHVar2;
    if (pHVar2 == (HashElement *)0x0) {
      this->lasthashelem = pHVar5;
    }
    else {
      pHVar2->listprev = pHVar5;
    }
  }
  pRVar3 = (this->super_RTPMemoryObject).mgr;
  if (pRVar3 == (RTPMemoryManager *)0x0) {
    if (pHVar7 != (HashElement *)0x0) {
      operator_delete(pHVar7,0x28);
    }
  }
  else {
    (**(code **)(*(long *)pRVar3 + 0x18))(pRVar3,pHVar7);
  }
  this->curhashelem = pHVar2;
  return 0;
}

Assistant:

inline int RTPHashTable<Element,GetIndex,hashsize>::DeleteElement(const Element &elem)
{
	int status;

	status = GotoElement(elem);
	if (status < 0)
		return status;
	return DeleteCurrentElement();
}